

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.h
# Opt level: O0

bool __thiscall S2EdgeCrosser::EdgeOrVertexCrossing(S2EdgeCrosser *this,S2Point *d)

{
  S2Point *c_00;
  int iVar1;
  int crossing;
  S2Point *c;
  S2Point *d_local;
  S2EdgeCrosser *this_local;
  
  c_00 = this->c_;
  iVar1 = CrossingSign(this,d);
  if (iVar1 < 0) {
    this_local._7_1_ = false;
  }
  else if (iVar1 < 1) {
    this_local._7_1_ = S2::VertexCrossing(this->a_,this->b_,c_00,d);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline bool S2EdgeCrosser::EdgeOrVertexCrossing(const S2Point* d) {
  // We need to copy c_ since it is clobbered by CrossingSign().
  const S2Point* c = c_;
  int crossing = CrossingSign(d);
  if (crossing < 0) return false;
  if (crossing > 0) return true;
  return S2::VertexCrossing(*a_, *b_, *c, *d);
}